

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

string * __thiscall
duckdb::Linenoise::AddContinuationMarkers_abi_cxx11_
          (string *__return_storage_ptr__,Linenoise *this,char *buf,size_t len,int plen,
          int cursor_row,vector<duckdb::highlightToken,_true> *tokens)

{
  bool bVar1;
  ulong uVar2;
  undefined8 *puVar3;
  reference pvVar4;
  long lVar5;
  pointer phVar6;
  int i;
  char *pcVar7;
  pointer phVar8;
  ulong uVar9;
  ulong __n;
  size_t cpos;
  size_t local_b8;
  char *local_b0;
  int local_a4;
  int local_a0;
  int rows;
  char *local_98;
  int local_90;
  int cols;
  Linenoise *local_88;
  size_t local_80;
  vector<duckdb::highlightToken,_true> new_tokens;
  value_type local_58;
  size_t local_40;
  long local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cpos = 0;
  rows = 1;
  new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a4 = cursor_row;
  cols = plen;
  local_88 = this;
  local_80 = len;
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            (&new_tokens.
              super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
             ((long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_38 = (long)plen;
  __n = 0;
  local_b0 = (char *)0x0;
  uVar9 = 0;
  uVar2 = 0;
  local_a0 = plen;
  while (uVar2 < local_80) {
    bVar1 = IsNewline(buf[uVar2]);
    NextPosition(local_88,buf,local_80,&cpos,&rows,&cols,local_a0);
    for (; uVar9 < cpos; uVar9 = uVar9 + 1) {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    uVar2 = cpos;
    if (bVar1) {
      local_90 = rows;
      puVar3 = &continuationPrompt;
      if (rows == local_a4) {
        puVar3 = &continuationSelectedPrompt;
      }
      pcVar7 = anon_var_dwarf_4bacfca + 9;
      if (local_88->continuation_markers != false) {
        pcVar7 = (char *)*puVar3;
      }
      local_40 = strlen(pcVar7);
      local_98 = pcVar7;
      local_b8 = ComputeRenderWidth(pcVar7,local_40);
      for (uVar2 = local_b8 & 0xffffffff; (int)uVar2 < local_a0; uVar2 = (ulong)((int)uVar2 + 1)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar7 = (char *)((local_38 - local_b8) + local_40);
      phVar8 = (tokens->
               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_start;
      phVar6 = (tokens->
               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (__n < (ulong)(((long)phVar6 - (long)phVar8) / 0x18)) {
        while ((__n < (ulong)(((long)phVar6 - (long)phVar8) / 0x18) &&
               (pvVar4 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n),
               pvVar4->start < cpos))) {
          pvVar4 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
          pvVar4->start = (size_t)(local_b0 + pvVar4->start);
          pvVar4 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
          ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                    (&new_tokens.
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                     pvVar4);
          __n = __n + 1;
          phVar8 = (tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          phVar6 = (tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        local_98 = pcVar7;
        if ((__n == 0) ||
           (((long)(tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(tokens->
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1U <= __n)) {
          local_b8 = local_b8 & 0xffffffff00000000;
        }
        else {
          pvVar4 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n - 1);
          local_b8 = CONCAT44(local_b8._4_4_,(int)CONCAT71((int7)((ulong)pvVar4 >> 8),pvVar4->type))
          ;
        }
        pcVar7 = local_b0;
        local_58.start = (size_t)(local_b0 + cpos);
        local_58.type = local_90 == local_a4 | TOKEN_CONTINUATION;
        local_58.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&new_tokens.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   &local_58);
        pcVar7 = local_98 + (long)pcVar7;
        local_58.start = (size_t)(pcVar7 + cpos);
        local_58.type = (tokenType)local_b8;
        local_58.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&new_tokens.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   &local_58);
        uVar2 = cpos;
        local_b0 = pcVar7;
      }
      else {
        local_b0 = pcVar7 + (long)local_b0;
        uVar2 = cpos;
      }
    }
  }
  for (; uVar9 < uVar2; uVar9 = uVar9 + 1) {
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    uVar2 = cpos;
  }
  for (; lVar5 = (long)(tokens->
                       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ).
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(tokens->
                       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ).
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_start, __n < (ulong)(lVar5 / 0x18);
      __n = __n + 1) {
    pvVar4 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
    pvVar4->start = (size_t)(local_b0 + pvVar4->start);
    pvVar4 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              (&new_tokens.
                super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,pvVar4
              );
  }
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::_M_move_assign
            (&tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
             (_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
             &new_tokens,lVar5 % 0x18);
  ::std::_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
  ~_Vector_base((_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                &new_tokens);
  return __return_storage_ptr__;
}

Assistant:

string Linenoise::AddContinuationMarkers(const char *buf, size_t len, int plen, int cursor_row,
                                         vector<highlightToken> &tokens) const {
	std::string result;
	int rows = 1;
	int cols = plen;
	size_t cpos = 0;
	size_t prev_pos = 0;
	size_t extra_bytes = 0;    // extra bytes introduced
	size_t token_position = 0; // token position
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size());
	while (cpos < len) {
		bool is_newline = IsNewline(buf[cpos]);
		NextPosition(buf, len, cpos, rows, cols, plen);
		for (; prev_pos < cpos; prev_pos++) {
			result += buf[prev_pos];
		}
		if (is_newline) {
			bool is_cursor_row = rows == cursor_row;
			const char *prompt = is_cursor_row ? continuationSelectedPrompt : continuationPrompt;
			if (!continuation_markers) {
				prompt = "";
			}
			size_t continuationLen = strlen(prompt);
			size_t continuationRender = ComputeRenderWidth(prompt, continuationLen);
			// pad with spaces prior to prompt
			for (int i = int(continuationRender); i < plen; i++) {
				result += " ";
			}
			result += prompt;
			size_t continuationBytes = plen - continuationRender + continuationLen;
			if (token_position < tokens.size()) {
				for (; token_position < tokens.size(); token_position++) {
					if (tokens[token_position].start >= cpos) {
						// not there yet
						break;
					}
					tokens[token_position].start += extra_bytes;
					new_tokens.push_back(tokens[token_position]);
				}
				tokenType prev_type = tokenType::TOKEN_IDENTIFIER;
				if (token_position > 0 && token_position < tokens.size() + 1) {
					prev_type = tokens[token_position - 1].type;
				}
				highlightToken token;
				token.start = cpos + extra_bytes;
				token.type = is_cursor_row ? tokenType::TOKEN_CONTINUATION_SELECTED : tokenType::TOKEN_CONTINUATION;
				token.search_match = false;
				new_tokens.push_back(token);

				token.start = cpos + extra_bytes + continuationBytes;
				token.type = prev_type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			extra_bytes += continuationBytes;
		}
	}
	for (; prev_pos < cpos; prev_pos++) {
		result += buf[prev_pos];
	}
	for (; token_position < tokens.size(); token_position++) {
		tokens[token_position].start += extra_bytes;
		new_tokens.push_back(tokens[token_position]);
	}
	tokens = std::move(new_tokens);
	return result;
}